

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O3

void __thiscall
duckdb::ART::VerifyConstraint
          (ART *this,DataChunk *chunk,IndexAppendInfo *info,ConflictManager *manager)

{
  mutex *__mutex;
  VerifyExistenceType verify_type;
  int iVar1;
  Allocator *pAVar2;
  unsafe_optional_ptr<const_Node> leaf;
  ConstraintException *this_00;
  _Alloc_hider _Var3;
  idx_t iVar4;
  long lVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  optional_idx conflict_idx;
  string key_name;
  unsafe_vector<ARTKey> keys;
  DataChunk expr_chunk;
  string exception_msg;
  ArenaAllocator arena_allocator;
  optional_idx local_120;
  optional_ptr<duckdb::ART,_true> local_118;
  string local_110;
  vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_> local_f0;
  DataChunk local_d8;
  string local_98;
  ArenaAllocator local_78;
  
  __mutex = &(this->super_BoundIndex).lock;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    ::std::__throw_system_error(iVar1);
  }
  DataChunk::DataChunk(&local_d8);
  pAVar2 = Allocator::DefaultAllocator();
  DataChunk::Initialize(&local_d8,pAVar2,&(this->super_BoundIndex).logical_types,0x800);
  BoundIndex::ExecuteExpressions(&this->super_BoundIndex,chunk,&local_d8);
  pAVar2 = BufferAllocator::Get((this->super_BoundIndex).super_Index.db);
  ArenaAllocator::ArenaAllocator(&local_78,pAVar2,0x800);
  ::std::vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>::vector
            (&local_f0,local_d8.count,(allocator_type *)&local_110);
  GenerateKeys<false>(this,&local_78,&local_d8,(unsafe_vector<ARTKey> *)&local_f0);
  if ((info->delete_index).ptr == (BoundIndex *)0x0) {
    local_118.ptr = (ART *)0x0;
  }
  else {
    optional_ptr<duckdb::BoundIndex,_true>::CheckValid(&info->delete_index);
    local_118.ptr = (ART *)(info->delete_index).ptr;
  }
  local_120.index = 0xffffffffffffffff;
  if (chunk->count == 0) {
    bVar7 = true;
  }
  else {
    _Var6._M_p = (pointer)0xffffffffffffffff;
    lVar5 = 0;
    iVar4 = 0;
    do {
      if (*(long *)((long)&(local_f0.
                            super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                            _M_impl.super__Vector_impl_data._M_start)->len + lVar5) == 0) {
        bVar7 = ConflictManager::AddNull(manager,iVar4);
        _Var3._M_p = (pointer)0xffffffffffffffff;
        if (bVar7) {
          optional_idx::optional_idx((optional_idx *)&local_110,iVar4);
LAB_015aaad5:
          local_120.index = (idx_t)local_110._M_dataplus._M_p;
          _Var3._M_p = local_110._M_dataplus._M_p;
          _Var6._M_p = local_110._M_dataplus._M_p;
        }
      }
      else {
        leaf = Lookup(this,&this->tree,
                      (ARTKey *)
                      ((long)&(local_f0.
                               super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                               _M_impl.super__Vector_impl_data._M_start)->len + lVar5),0);
        if (leaf.ptr == (Node *)0x0) {
          bVar7 = ConflictManager::AddMiss(manager,iVar4);
          _Var3._M_p = (pointer)0xffffffffffffffff;
          if (bVar7) {
            optional_idx::optional_idx((optional_idx *)&local_110,iVar4);
            goto LAB_015aaad5;
          }
        }
        else {
          VerifyLeaf(this,leaf.ptr,
                     (ARTKey *)
                     ((long)&(local_f0.
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar5),local_118,
                     manager,&local_120,iVar4);
          _Var3._M_p = (pointer)local_120.index;
          _Var6._M_p = (pointer)local_120.index;
        }
      }
      if (_Var3._M_p != (pointer)0xffffffffffffffff) break;
      iVar4 = iVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (iVar4 < chunk->count);
    bVar7 = _Var6._M_p == (pointer)0xffffffffffffffff;
  }
  ConflictManager::FinishLookup(manager);
  if (!bVar7) {
    iVar4 = optional_idx::GetIndex(&local_120);
    GenerateErrorKeyName_abi_cxx11_(&local_110,this,chunk,iVar4);
    verify_type = ConflictManager::LookupType(manager);
    GenerateConstraintErrorMessage(&local_98,this,verify_type,&local_110);
    this_00 = (ConstraintException *)__cxa_allocate_exception(0x10);
    ConstraintException::ConstraintException(this_00,(string *)&local_98);
    __cxa_throw(this_00,&ConstraintException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (local_f0.super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  ArenaAllocator::~ArenaAllocator(&local_78);
  DataChunk::~DataChunk(&local_d8);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void ART::VerifyConstraint(DataChunk &chunk, IndexAppendInfo &info, ConflictManager &manager) {
	// Lock the index during constraint checking.
	lock_guard<mutex> l(lock);

	DataChunk expr_chunk;
	expr_chunk.Initialize(Allocator::DefaultAllocator(), logical_types);
	ExecuteExpressions(chunk, expr_chunk);

	ArenaAllocator arena_allocator(BufferAllocator::Get(db));
	unsafe_vector<ARTKey> keys(expr_chunk.size());
	GenerateKeys<>(arena_allocator, expr_chunk, keys);

	optional_ptr<ART> delete_art;
	if (info.delete_index) {
		delete_art = info.delete_index->Cast<ART>();
	}

	optional_idx conflict_idx;
	for (idx_t i = 0; !conflict_idx.IsValid() && i < chunk.size(); i++) {
		if (keys[i].Empty()) {
			if (manager.AddNull(i)) {
				conflict_idx = i;
			}
			continue;
		}

		auto leaf = Lookup(tree, keys[i], 0);
		if (!leaf) {
			if (manager.AddMiss(i)) {
				conflict_idx = i;
			}
			continue;
		}
		VerifyLeaf(*leaf, keys[i], delete_art, manager, conflict_idx, i);
	}

	manager.FinishLookup();
	if (!conflict_idx.IsValid()) {
		return;
	}

	auto key_name = GenerateErrorKeyName(chunk, conflict_idx.GetIndex());
	auto exception_msg = GenerateConstraintErrorMessage(manager.LookupType(), key_name);
	throw ConstraintException(exception_msg);
}